

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

bool __thiscall cmsys::Directory::Load(Directory *this,string *name)

{
  DirectoryInternals *this_00;
  char *pcVar1;
  allocator local_51;
  value_type local_50;
  dirent64 *local_30;
  dirent *d;
  DIR *dir;
  string *name_local;
  Directory *this_local;
  
  dir = (DIR *)name;
  name_local = (string *)this;
  Clear(this);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  d = (dirent *)opendir(pcVar1);
  if (d == (dirent *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_30 = readdir64((DIR *)d);
    while (local_30 != (dirent64 *)0x0) {
      this_00 = this->Internal;
      pcVar1 = local_30->d_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this_00->Files,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      local_30 = readdir64((DIR *)d);
    }
    std::__cxx11::string::operator=((string *)&this->Internal->Path,(string *)dir);
    closedir((DIR *)d);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Directory::Load(const std::string& name)
{
  this->Clear();

  DIR* dir = opendir(name.c_str());

  if (!dir) {
    return 0;
  }

  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.push_back(d->d_name);
  }
  this->Internal->Path = name;
  closedir(dir);
  return 1;
}